

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O1

int dospit(void)

{
  int iVar1;
  obj *obj;
  schar dz;
  schar dy;
  schar dx;
  schar local_b;
  schar local_a;
  schar local_9;
  
  iVar1 = getdir((char *)0x0,&local_9,&local_a,&local_b);
  if (iVar1 != 0) {
    obj = mksobj(level,u.umonnum == 0xe1 ^ 0x219,'\x01','\0');
    obj->spe = '\x01';
    throwit(obj,(obj *)0x0,0,'\0',local_9,local_a,local_b);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int dospit(void)
{
	struct obj *otmp;
	schar dx, dy, dz;

	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;
	otmp = mksobj(level, u.umonnum==PM_COBRA ? BLINDING_VENOM : ACID_VENOM,
			TRUE, FALSE);
	otmp->spe = 1; /* to indicate it's yours */
	throwit(otmp, NULL, 0L, FALSE, dx, dy, dz);
	return 1;
}